

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

bool __thiscall cmCTestMultiProcessHandler::CheckStopTimePassed(cmCTestMultiProcessHandler *this)

{
  bool bVar1;
  bool local_31;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  time_point stop_time;
  cmCTestMultiProcessHandler *this_local;
  
  if ((this->StopTimePassed & 1U) == 0) {
    stop_time.__d.__r = (duration)(duration)this;
    local_18.__d.__r = (duration)cmCTest::GetStopTime(this->CTest);
    std::chrono::
    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(&local_20);
    bVar1 = std::chrono::operator!=(&local_18,&local_20);
    local_31 = false;
    if (bVar1) {
      local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_31 = std::chrono::operator<=(&local_18,&local_28);
    }
    if (local_31 != false) {
      SetStopTimePassed(this);
    }
  }
  return (bool)(this->StopTimePassed & 1);
}

Assistant:

bool cmCTestMultiProcessHandler::CheckStopTimePassed()
{
  if (!this->StopTimePassed) {
    std::chrono::system_clock::time_point stop_time =
      this->CTest->GetStopTime();
    if (stop_time != std::chrono::system_clock::time_point() &&
        stop_time <= std::chrono::system_clock::now()) {
      this->SetStopTimePassed();
    }
  }
  return this->StopTimePassed;
}